

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void SkipMatchesSpec(UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                    size_t _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue)

{
  uint uVar1;
  UInt32 *pUVar2;
  bool local_81;
  uint local_80;
  uint local_7c;
  uint local_64;
  uint len;
  Byte *pb;
  CLzRef *pair;
  UInt32 delta;
  UInt32 cmCheck;
  uint len1;
  uint len0;
  CLzRef *ptr1;
  CLzRef *ptr0;
  size_t _cyclicBufferPos_local;
  CLzRef *son_local;
  Byte *cur_local;
  UInt32 local_10;
  UInt32 pos_local;
  UInt32 curMatch_local;
  UInt32 lenLimit_local;
  
  ptr1 = son + _cyclicBufferPos * 2 + 1;
  _len1 = son + _cyclicBufferPos * 2;
  cmCheck = 0;
  delta = 0;
  pair._4_4_ = pos - _cyclicBufferSize;
  if (pos <= _cyclicBufferSize) {
    pair._4_4_ = 0;
  }
  local_10 = curMatch;
  if (pair._4_4_ < curMatch) {
    do {
      uVar1 = pos - local_10;
      if (_cyclicBufferPos < uVar1) {
        local_7c = _cyclicBufferSize;
      }
      else {
        local_7c = 0;
      }
      pUVar2 = son + ((_cyclicBufferPos - uVar1) + (ulong)local_7c) * 2;
      if (cmCheck < delta) {
        local_80 = cmCheck;
      }
      else {
        local_80 = delta;
      }
      local_64 = local_80;
      if (cur[(ulong)local_80 - (ulong)uVar1] == cur[local_80]) {
        do {
          local_64 = local_64 + 1;
          if (local_64 == lenLimit) break;
        } while (cur[(ulong)local_64 - (ulong)uVar1] == cur[local_64]);
        if (local_64 == lenLimit) {
          *_len1 = *pUVar2;
          *ptr1 = pUVar2[1];
          return;
        }
      }
      if (cur[(ulong)local_64 - (ulong)uVar1] < cur[local_64]) {
        *_len1 = local_10;
        local_10 = pUVar2[1];
        _len1 = pUVar2 + 1;
        delta = local_64;
      }
      else {
        *ptr1 = local_10;
        local_10 = *pUVar2;
        cmCheck = local_64;
        ptr1 = pUVar2;
      }
      cutValue = cutValue - 1;
      local_81 = cutValue != 0 && pair._4_4_ < local_10;
    } while (local_81);
  }
  *_len1 = 0;
  *ptr1 = 0;
  return;
}

Assistant:

static void SkipMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte *cur, CLzRef *son,
    size_t _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue)
{
  CLzRef *ptr0 = son + ((size_t)_cyclicBufferPos << 1) + 1;
  CLzRef *ptr1 = son + ((size_t)_cyclicBufferPos << 1);
  unsigned len0 = 0, len1 = 0;

  UInt32 cmCheck;

  cmCheck = (UInt32)(pos - _cyclicBufferSize);
  if ((UInt32)pos <= _cyclicBufferSize)
    cmCheck = 0;

  if (// curMatch >= pos ||  // failure
      cmCheck < curMatch)
  do
  {
    const UInt32 delta = pos - curMatch;
    {
      CLzRef *pair = son + ((size_t)(_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte *pb = cur - delta;
      unsigned len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len])
      {
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        {
          if (len == lenLimit)
          {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return;
          }
        }
      }
      if (pb[len] < cur[len])
      {
        *ptr1 = curMatch;
        curMatch = pair[1];
        ptr1 = pair + 1;
        len1 = len;
      }
      else
      {
        *ptr0 = curMatch;
        curMatch = pair[0];
        ptr0 = pair;
        len0 = len;
      }
    }
  }
  while(--cutValue && cmCheck < curMatch);
  
  *ptr0 = *ptr1 = kEmptyHashValue;
  return;
}